

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmisc.c
# Opt level: O0

uint pseudo_gen_alloc(PseudoGenerator *generator,_Bool top)

{
  int iVar1;
  bool bVar2;
  uint j;
  uint i;
  int j_1;
  uint64_t bit;
  int i_1;
  int is_set;
  int current_top;
  uint reg;
  _Bool top_local;
  PseudoGenerator *generator_local;
  
  if (top) {
    iVar1 = top_reg(generator);
    is_set = iVar1 + 1;
  }
  else {
    is_set = 0;
    bVar2 = true;
    for (bit._4_4_ = 0; bVar2 && bit._4_4_ < 4; bit._4_4_ = bit._4_4_ + 1) {
      if (generator->bits[bit._4_4_] == 0xffffffffffffffff) {
        is_set = is_set + 0x40;
      }
      else {
        for (j = 0; bVar2 && (int)j < 0x40; j = j + 1) {
          bVar2 = (generator->bits[bit._4_4_] & 1L << ((byte)j & 0x3f)) != 0;
          if (bVar2) {
            is_set = is_set + 1;
          }
        }
      }
    }
  }
  generator->bits[(uint)is_set >> 6] =
       1L << ((byte)is_set & 0x3f) | generator->bits[(uint)is_set >> 6];
  if ((uint)is_set <= generator->max_reg) {
    if (is_set == generator->max_reg) {
      generator->max_reg = generator->max_reg + 1;
    }
    return is_set;
  }
  __assert_fail("reg <= generator->max_reg",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/tests/tmisc.c"
                ,0x12e,"unsigned int pseudo_gen_alloc(PseudoGenerator *, _Bool)");
}

Assistant:

static unsigned pseudo_gen_alloc(PseudoGenerator *generator, bool top)
{
	unsigned reg;
	if (top) {
		int current_top = top_reg(generator);
		reg = current_top + 1;
	} else {
		/* look for the first free reg */
		reg = 0;
		int is_set = 1;
		for (int i = 0; is_set && i < N_WORDS; i++) {
			uint64_t bit = generator->bits[i];
			if (bit == ~0ull) {
				/* all bits set? skip */ 
				reg += ESIZE;
				continue;
			} 
			for (int j = 0; is_set && j < ESIZE; j++) {
				is_set = (bit & (1ull << j)) != 0;
				if (is_set)
					reg++;
			}
		}
	}
	unsigned i = reg / ESIZE;
	unsigned j = reg % ESIZE;
	generator->bits[i] |= (1ull << j);
	assert(reg <= generator->max_reg);
	if (reg == generator->max_reg)
		generator->max_reg += 1;
	return reg;
}